

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOStreamBuffer.h
# Opt level: O3

bool __thiscall
Assimp::IOStreamBuffer<char>::getNextBlock
          (IOStreamBuffer<char> *this,vector<char,_std::allocator<char>_> *buffer)

{
  pointer pcVar1;
  pointer pcVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar5;
  allocator_type local_39;
  pointer local_38;
  pointer pcStack_30;
  pointer local_28;
  ulong uVar4;
  
  if (this->m_cachePos == 0) {
    (*this->m_stream->_vptr_IOStream[4])(this->m_stream,this->m_filePos,0);
    iVar3 = (*this->m_stream->_vptr_IOStream[2])
                      (this->m_stream,
                       (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,1,this->m_cacheSize);
    uVar4 = CONCAT44(extraout_var,iVar3);
    if (uVar4 == 0) {
      return false;
    }
    uVar5 = this->m_cacheSize;
    if (uVar4 < this->m_cacheSize) {
      this->m_cacheSize = uVar4;
      uVar5 = uVar4;
    }
    this->m_filePos = this->m_filePos + uVar5;
    this->m_cachePos = 0;
    this->m_blockIdx = this->m_blockIdx + 1;
    std::vector<char,std::allocator<char>>::
    vector<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((vector<char,std::allocator<char>> *)&local_38,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_39);
    pcVar1 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pcVar2 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_start = local_38;
    (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pcStack_30;
    (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = local_28;
    local_28 = (pointer)0x0;
    local_38 = (pointer)0x0;
    pcStack_30 = (pointer)0x0;
    if ((pcVar1 != (pointer)0x0) &&
       (operator_delete(pcVar1,(long)pcVar2 - (long)pcVar1), local_38 != (pointer)0x0)) {
      operator_delete(local_38,(long)local_28 - (long)local_38);
    }
  }
  else {
    std::vector<char,std::allocator<char>>::
    vector<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((vector<char,std::allocator<char>> *)&local_38,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               ((this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start + this->m_cachePos),
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_39);
    pcVar1 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pcVar2 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_start = local_38;
    (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pcStack_30;
    (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = local_28;
    local_38 = (pointer)0x0;
    pcStack_30 = (pointer)0x0;
    local_28 = (pointer)0x0;
    if ((pcVar1 != (pointer)0x0) &&
       (operator_delete(pcVar1,(long)pcVar2 - (long)pcVar1), local_38 != (pointer)0x0)) {
      operator_delete(local_38,(long)local_28 - (long)local_38);
    }
    this->m_cachePos = 0;
  }
  return true;
}

Assistant:

AI_FORCE_INLINE
bool IOStreamBuffer<T>::getNextBlock( std::vector<T> &buffer) {
    // Return the last block-value if getNextLine was used before
    if ( 0 != m_cachePos ) {      
        buffer = std::vector<T>( m_cache.begin() + m_cachePos, m_cache.end() );
        m_cachePos = 0;
    } else {
        if ( !readNextBlock() ) {
            return false;
        }

        buffer = std::vector<T>(m_cache.begin(), m_cache.end());
    }

    return true;
}